

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [22],int *params_1,
          char (*params_2) [3],char **params_3,char (*params_4) [9],String *params_5,
          String *params_6,char *params_7)

{
  char *pcVar1;
  long lVar2;
  FixedArray<char,_1UL> *params_7_00;
  undefined1 local_a9 [9];
  char *local_a0;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  undefined1 local_78 [24];
  size_t local_60;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_60 = strlen((char *)this);
  local_78._16_8_ = this;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(int *)*params);
  local_78._8_8_ = strlen((char *)params_1);
  pcVar1 = *(char **)params_2;
  local_78._0_8_ = params_1;
  local_88.size_ = strlen(pcVar1);
  params_7_00 = (FixedArray<char,_1UL> *)0x2aad1e;
  local_88.ptr = pcVar1;
  local_98.size_ = strlen((char *)params_3);
  lVar2 = *(long *)(*params_4 + 8);
  local_a9._1_8_ = lVar2;
  if (lVar2 != 0) {
    local_a9._1_8_ = *(undefined8 *)*params_4;
  }
  local_a0 = (char *)(lVar2 + -1);
  if (lVar2 == 0) {
    local_a0 = (char *)0x0;
  }
  pcVar1 = (char *)(params_5->content).size_;
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = (params_5->content).ptr;
  }
  local_58.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_58.size_ = (size_t)(char *)0x0;
  }
  local_a9[0] = *(undefined1 *)&(params_6->content).ptr;
  local_98.ptr = (char *)params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)(local_78 + 0x10),(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_78,&local_88,&local_98,
             (ArrayPtr<const_char> *)(local_a9 + 1),&local_58,(ArrayPtr<const_char> *)local_a9,
             params_7_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}